

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O3

int __thiscall FIWadManager::ScanIWAD(FIWadManager *this,char *iwad)

{
  char *__s1;
  int iVar1;
  char *in_RAX;
  FResourceFile *pFVar2;
  undefined4 extraout_var;
  size_t len;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint *puVar6;
  FString mapname;
  FString local_38;
  
  local_38.Chars = in_RAX;
  pFVar2 = FResourceFile::OpenResourceFile(iwad,(FileReader *)0x0,true,false);
  if (pFVar2 != (FResourceFile *)0x0) {
    ClearChecks(this);
    if (pFVar2->NumLumps != 0) {
      uVar5 = 0;
      do {
        iVar1 = (*pFVar2->_vptr_FResourceFile[4])(pFVar2,(ulong)uVar5);
        CheckLumpName(this,(char *)(CONCAT44(extraout_var,iVar1) + 0x18));
        __s1 = *(char **)(CONCAT44(extraout_var,iVar1) + 0x10);
        if (*(int *)(__s1 + -0xc) != 0) {
          iVar1 = strncasecmp(__s1,"maps/",5);
          if (iVar1 == 0) {
            len = strcspn(__s1 + 5,".");
            FString::FString(&local_38,__s1 + 5,len);
            CheckLumpName(this,local_38.Chars);
            FString::~FString(&local_38);
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < pFVar2->NumLumps);
    }
    (*pFVar2->_vptr_FResourceFile[1])(pFVar2);
  }
  uVar4 = (ulong)(this->mIWads).Count;
  if (uVar4 != 0) {
    puVar6 = &(((this->mIWads).Array)->Lumps).Count;
    uVar3 = 0;
    do {
      if ((-1 << ((byte)*puVar6 & 0x1f) ^ (this->mLumpsFound).Array[uVar3]) == 0xffffffff)
      goto LAB_003676e8;
      uVar3 = uVar3 + 1;
      puVar6 = puVar6 + 0x18;
    } while (uVar4 != uVar3);
  }
  uVar3 = 0xffffffff;
LAB_003676e8:
  return (int)uVar3;
}

Assistant:

int FIWadManager::ScanIWAD (const char *iwad)
{
	FResourceFile *iwadfile = FResourceFile::OpenResourceFile(iwad, NULL, true);

	if (iwadfile != NULL)
	{
		ClearChecks();
		for(DWORD ii = 0; ii < iwadfile->LumpCount(); ii++)
		{
			FResourceLump *lump = iwadfile->GetLump(ii);

			CheckLumpName(lump->Name);
			if (lump->FullName.IsNotEmpty())
			{
				if (strnicmp(lump->FullName, "maps/", 5) == 0)
				{
					FString mapname(&lump->FullName[5], strcspn(&lump->FullName[5], "."));
					CheckLumpName(mapname);
				}
			}
		}
		delete iwadfile;
	}
	return GetIWadInfo();
}